

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

char * string_find(char *it,char *end,char *data)

{
  _Bool _Var1;
  char *local_28;
  
  while( true ) {
    if (end <= it) {
      return (char *)0x0;
    }
    local_28 = it;
    _Var1 = skip_string(&local_28,end,data);
    if (_Var1) break;
    it = local_28 + 1;
  }
  return it;
}

Assistant:

static inline const char* string_find(const char* it, const char* end, const char* data)
{
    while(it < end) {
        const char* begin = it;
        if(skip_string(&it, end, data))
            return begin;
        ++it;
    }

    return NULL;
}